

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.c
# Opt level: O0

PGMData * binaryPGM(PGMData *data)

{
  int local_18;
  int local_14;
  int j;
  int i;
  PGMData *data_local;
  
  for (local_14 = 0; local_14 < data->row; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < data->col; local_18 = local_18 + 1) {
      if ((data->pixel_matrix[local_14][local_18] != 0.0) ||
         (NAN(data->pixel_matrix[local_14][local_18]))) {
        data->pixel_matrix[local_14][local_18] = 1.0;
      }
    }
  }
  data->max_greyscale = 1;
  return data;
}

Assistant:

PGMData *binaryPGM(PGMData *data)
{
    for (int i = 0; i < data->row; i++)
    {
        for (int j = 0; j < data->col; j++)
        {
            if (data->pixel_matrix[i][j] != 0)
                data->pixel_matrix[i][j] = 1;
        }
    }

    data->max_greyscale = 1;

    return data;
}